

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__pic_info(stbi__context *s,int *x,int *y,int *comp)

{
  stbi_uc sVar1;
  stbi_uc sVar2;
  int iVar3;
  long lVar4;
  stbi__pic_packet *packet;
  stbi__pic_packet packets [10];
  int local_38;
  int chained;
  int num_packets;
  int act_comp;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  chained = 0;
  local_38 = 0;
  iVar3 = stbi__pic_is4(s,anon_var_dwarf_3d5e5);
  if (iVar3 == 0) {
    stbi__rewind(s);
    s_local._4_4_ = 0;
  }
  else {
    stbi__skip(s,0x58);
    iVar3 = stbi__get16be(s);
    *x = iVar3;
    iVar3 = stbi__get16be(s);
    *y = iVar3;
    iVar3 = stbi__at_eof(s);
    if (iVar3 == 0) {
      if ((*x == 0) || (*y <= (int)(0x10000000 / (long)*x))) {
        stbi__skip(s,8);
        do {
          if (local_38 == 10) {
            return 0;
          }
          lVar4 = (long)local_38;
          sVar1 = stbi__get8(s);
          sVar2 = stbi__get8(s);
          packets[lVar4 + -3].type = sVar2;
          sVar2 = stbi__get8(s);
          packets[lVar4 + -3].channel = sVar2;
          sVar2 = stbi__get8(s);
          packets[lVar4 + -2].size = sVar2;
          chained = (uint)packets[lVar4 + -2].size | chained;
          iVar3 = stbi__at_eof(s);
          if (iVar3 != 0) {
            stbi__rewind(s);
            return 0;
          }
          if (packets[lVar4 + -3].type != '\b') {
            stbi__rewind(s);
            return 0;
          }
          local_38 = local_38 + 1;
        } while (sVar1 != '\0');
        iVar3 = 3;
        if ((chained & 0x10U) != 0) {
          iVar3 = 4;
        }
        *comp = iVar3;
        s_local._4_4_ = 1;
      }
      else {
        stbi__rewind(s);
        s_local._4_4_ = 0;
      }
    }
    else {
      stbi__rewind(s);
      s_local._4_4_ = 0;
    }
  }
  return s_local._4_4_;
}

Assistant:

static int stbi__pic_info(stbi__context *s, int *x, int *y, int *comp)
{
   int act_comp=0,num_packets=0,chained;
   stbi__pic_packet packets[10];

   if (!stbi__pic_is4(s,"\x53\x80\xF6\x34")) {
      stbi__rewind(s);
      return 0;
   }

   stbi__skip(s, 88);

   *x = stbi__get16be(s);
   *y = stbi__get16be(s);
   if (stbi__at_eof(s)) {
      stbi__rewind( s);
      return 0;
   }
   if ( (*x) != 0 && (1 << 28) / (*x) < (*y)) {
      stbi__rewind( s );
      return 0;
   }

   stbi__skip(s, 8);

   do {
      stbi__pic_packet *packet;

      if (num_packets==sizeof(packets)/sizeof(packets[0]))
         return 0;

      packet = &packets[num_packets++];
      chained = stbi__get8(s);
      packet->size    = stbi__get8(s);
      packet->type    = stbi__get8(s);
      packet->channel = stbi__get8(s);
      act_comp |= packet->channel;

      if (stbi__at_eof(s)) {
          stbi__rewind( s );
          return 0;
      }
      if (packet->size != 8) {
          stbi__rewind( s );
          return 0;
      }
   } while (chained);

   *comp = (act_comp & 0x10 ? 4 : 3);

   return 1;
}